

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesEngineGetActivityExt(zes_engine_handle_t hEngine,uint32_t *pCount,zes_engine_stats_t *pStats)

{
  zes_pfnEngineGetActivityExt_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnEngineGetActivityExt_t pfnGetActivityExt;
  zes_engine_stats_t *pStats_local;
  uint32_t *pCount_local;
  zes_engine_handle_t hEngine_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Engine).pfnGetActivityExt;
    if (p_Var1 == (zes_pfnEngineGetActivityExt_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hEngine_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hEngine_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hEngine_local._4_4_ = (*p_Var1)(hEngine,pCount,pStats);
    }
  }
  else {
    hEngine_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hEngine_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesEngineGetActivityExt(
    zes_engine_handle_t hEngine,                    ///< [in] Handle for the component.
    uint32_t* pCount,                               ///< [in,out] Pointer to the number of VF engine stats descriptors.
                                                    ///<  - if count is zero, the driver shall update the value with the total
                                                    ///< number of engine stats available.
                                                    ///<  - if count is greater than the total number of engine stats
                                                    ///< available, the driver shall update the value with the correct number
                                                    ///< of engine stats available.
                                                    ///<  - The count returned is the sum of number of VF instances currently
                                                    ///< available and the PF instance.
    zes_engine_stats_t* pStats                      ///< [in,out][optional][range(0, *pCount)] array of engine group activity counters.
                                                    ///<  - if count is less than the total number of engine stats available,
                                                    ///< then driver shall only retrieve that number of stats.
                                                    ///<  - the implementation shall populate the vector with engine stat for
                                                    ///< PF at index 0 of the vector followed by user provided pCount-1 number
                                                    ///< of VF engine stats.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnEngineGetActivityExt_t pfnGetActivityExt = [&result] {
        auto pfnGetActivityExt = ze_lib::context->zesDdiTable.load()->Engine.pfnGetActivityExt;
        if( nullptr == pfnGetActivityExt ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetActivityExt;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetActivityExt( hEngine, pCount, pStats );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetActivityExt = ze_lib::context->zesDdiTable.load()->Engine.pfnGetActivityExt;
    if( nullptr == pfnGetActivityExt ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetActivityExt( hEngine, pCount, pStats );
    #endif
}